

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::FileCryptoMetaData::~FileCryptoMetaData(FileCryptoMetaData *this)

{
  ~FileCryptoMetaData(this);
  operator_delete(this);
  return;
}

Assistant:

FileCryptoMetaData::~FileCryptoMetaData() noexcept {
}